

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UninterpretedOption::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  UninterpretedOption_NamePart *value;
  char *pcVar3;
  string *psVar4;
  uint64 value_00;
  int64 value_01;
  UnknownFieldSet *unknown_fields;
  double value_02;
  uint local_48;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  UninterpretedOption *this_local;
  
  local_48 = 0;
  uVar1 = name_size(this);
  _i = target;
  for (; local_48 < uVar1; local_48 = local_48 + 1) {
    value = name(this,local_48);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::UninterpretedOption_NamePart>
                   (2,value,deterministic,_i);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    identifier_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    identifier_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,iVar2,SERIALIZE,"google.protobuf.UninterpretedOption.identifier_value");
    psVar4 = identifier_value_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(3,psVar4,_i);
  }
  if ((uVar1 & 8) != 0) {
    value_00 = positive_int_value(this);
    _i = internal::WireFormatLite::WriteUInt64ToArray(4,value_00,_i);
  }
  if ((uVar1 & 0x10) != 0) {
    value_01 = negative_int_value(this);
    _i = internal::WireFormatLite::WriteInt64ToArray(5,value_01,_i);
  }
  if ((uVar1 & 0x20) != 0) {
    value_02 = double_value(this);
    _i = internal::WireFormatLite::WriteDoubleToArray(6,value_02,_i);
  }
  if ((uVar1 & 2) != 0) {
    psVar4 = string_value_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteBytesToArray(7,psVar4,_i);
  }
  if ((uVar1 & 4) != 0) {
    aggregate_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    aggregate_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,iVar2,SERIALIZE,"google.protobuf.UninterpretedOption.aggregate_value");
    psVar4 = aggregate_value_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(8,psVar4,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = UninterpretedOption::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0, n = this->name_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->name(i), deterministic, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4, this->positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(5, this->negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteDoubleToArray(6, this->double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        7, this->string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->aggregate_value(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}